

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

int mraa_find_i2c_bus_pci(char *pci_device,char *pci_id,char *adapter_name)

{
  mraa_boolean_t mVar1;
  uint uVar2;
  mraa_result_t mVar3;
  char *__ptr;
  byte *pbVar4;
  char *intStr;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  char delim;
  dirent **namelist;
  int ret;
  char *dup;
  char path [1024];
  
  snprintf(path,0x3ff,"/sys/devices/pci%s/%s/%s/",pci_device,pci_id,adapter_name);
  mVar1 = mraa_file_exist(path);
  if (mVar1 != 0) {
    uVar2 = scandir(path,(dirent ***)&namelist,(__selector *)0x0,alphasort);
    if ((int)uVar2 < 0) {
      syslog(3,"Failed to get information on i2c");
    }
    else {
      uVar6 = (ulong)uVar2;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        __ptr = strdup(namelist[uVar6]->d_name);
        dup = __ptr;
        if (__ptr == (char *)0x0) {
          syslog(3,"Ran out of memory!");
          break;
        }
        delim = '-';
        pbVar4 = (byte *)strsep(&dup,&delim);
        if (pbVar4 != (byte *)0x0) {
          iVar5 = *pbVar4 - 0x69;
          if ((iVar5 == 0) && (iVar5 = pbVar4[1] - 0x32, iVar5 == 0)) {
            iVar5 = 99 - (uint)pbVar4[2];
          }
          else {
            iVar5 = -iVar5;
          }
          if ((iVar5 == 0) && (intStr = strsep(&dup,&delim), intStr != (char *)0x0)) {
            ret = -1;
            mVar3 = mraa_atoi(intStr,&ret);
            free(__ptr);
            free(namelist[uVar6]);
            free(namelist);
            iVar5 = ret;
            if (mVar3 != MRAA_SUCCESS) {
              return -1;
            }
            syslog(5,"Adding i2c bus found on i2c-%d on adapter %s",(ulong)(uint)ret,adapter_name);
            return iVar5;
          }
        }
        free(__ptr);
        free(namelist[uVar6]);
      }
      free(namelist);
    }
  }
  return -1;
}

Assistant:

int
mraa_find_i2c_bus_pci(const char* pci_device, const char* pci_id, const char* adapter_name)
{
    /**
     * For example we'd get something like:
     * pci0000:00/0000:00:16.3/i2c_desiignware.3
     */
    char path[1024];
    snprintf(path, 1024 - 1, "/sys/devices/pci%s/%s/%s/", pci_device, pci_id, adapter_name);
    if (mraa_file_exist(path)) {
        struct dirent** namelist;
        int n;
        n = scandir(path, &namelist, NULL, alphasort);
        if (n < 0) {
            syslog(LOG_ERR, "Failed to get information on i2c");
            return -1;
        } else {
            while (n--) {
                char* dup = strdup(namelist[n]->d_name);
                char* orig_dup = dup;
                if (dup == NULL) {
                    syslog(LOG_ERR, "Ran out of memory!");
                    break;
                }
                const char delim = '-';
                char* token;
                token = strsep(&dup, &delim);
                if (token != NULL) {
                    if (strncmp("i2c", token, 3) == 0) {
                        token = strsep(&dup, &delim);
                        if (token != NULL) {
                            int ret = -1;
                            if (mraa_atoi(token, &ret) == MRAA_SUCCESS) {
                                free(orig_dup);
                                free(namelist[n]);
                                free(namelist);
                                syslog(LOG_NOTICE, "Adding i2c bus found on i2c-%d on adapter %s", ret, adapter_name);
                                return ret;
                            }
                            free(orig_dup);
                            free(namelist[n]);
                            free(namelist);
                            return -1;
                        }
                    }
                }
                free(orig_dup);
                free(namelist[n]);
            }
            free(namelist);
        }
    }
    return -1;
}